

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall
icu_63::RBBITableBuilder::setAdd(RBBITableBuilder *this,UVector *dest,UVector *source)

{
  int32_t newCapacity;
  int32_t newCapacity_00;
  int32_t iVar1;
  int iVar2;
  void **ppvVar3;
  void **ppvVar4;
  void **sourceLim;
  void **destLim;
  void **sourcePtr;
  void **destPtr;
  undefined1 local_150 [8];
  MaybeStackArray<void_*,_16> sourceArray;
  MaybeStackArray<void_*,_16> destArray;
  int32_t di;
  int32_t sourceSize;
  int32_t destOriginalSize;
  UVector *source_local;
  UVector *dest_local;
  RBBITableBuilder *this_local;
  
  newCapacity = UVector::size(dest);
  newCapacity_00 = UVector::size(source);
  destArray.stackArray[0xf]._4_4_ = 0;
  MaybeStackArray<void_*,_16>::MaybeStackArray
            ((MaybeStackArray<void_*,_16> *)(sourceArray.stackArray + 0xf));
  MaybeStackArray<void_*,_16>::MaybeStackArray((MaybeStackArray<void_*,_16> *)local_150);
  iVar1 = MaybeStackArray<void_*,_16>::getCapacity
                    ((MaybeStackArray<void_*,_16> *)(sourceArray.stackArray + 0xf));
  if ((newCapacity <= iVar1) ||
     (ppvVar3 = MaybeStackArray<void_*,_16>::resize
                          ((MaybeStackArray<void_*,_16> *)(sourceArray.stackArray + 0xf),newCapacity
                           ,0), ppvVar3 != (void **)0x0)) {
    sourcePtr = MaybeStackArray<void_*,_16>::getAlias
                          ((MaybeStackArray<void_*,_16> *)(sourceArray.stackArray + 0xf));
    ppvVar3 = sourcePtr + newCapacity;
    iVar1 = MaybeStackArray<void_*,_16>::getCapacity((MaybeStackArray<void_*,_16> *)local_150);
    if ((newCapacity_00 <= iVar1) ||
       (ppvVar4 = MaybeStackArray<void_*,_16>::resize
                            ((MaybeStackArray<void_*,_16> *)local_150,newCapacity_00,0),
       ppvVar4 != (void **)0x0)) {
      destLim = MaybeStackArray<void_*,_16>::getAlias((MaybeStackArray<void_*,_16> *)local_150);
      ppvVar4 = destLim + newCapacity_00;
      UVector::toArray(dest,sourcePtr);
      UVector::toArray(source,destLim);
      UVector::setSize(dest,newCapacity_00 + newCapacity,this->fStatus);
      while (destLim < ppvVar4 && sourcePtr < ppvVar3) {
        if (*sourcePtr == *destLim) {
          UVector::setElementAt(dest,*destLim,destArray.stackArray[0xf]._4_4_);
          destLim = destLim + 1;
          sourcePtr = sourcePtr + 1;
        }
        else {
          iVar2 = memcmp(sourcePtr,destLim,8);
          if (iVar2 < 0) {
            UVector::setElementAt(dest,*sourcePtr,destArray.stackArray[0xf]._4_4_);
            sourcePtr = sourcePtr + 1;
          }
          else {
            UVector::setElementAt(dest,*destLim,destArray.stackArray[0xf]._4_4_);
            destLim = destLim + 1;
          }
        }
        destArray.stackArray[0xf]._4_4_ = destArray.stackArray[0xf]._4_4_ + 1;
      }
      while (sourcePtr < ppvVar3) {
        UVector::setElementAt(dest,*sourcePtr,destArray.stackArray[0xf]._4_4_);
        sourcePtr = sourcePtr + 1;
        destArray.stackArray[0xf]._4_4_ = destArray.stackArray[0xf]._4_4_ + 1;
      }
      while (destLim < ppvVar4) {
        UVector::setElementAt(dest,*destLim,destArray.stackArray[0xf]._4_4_);
        destLim = destLim + 1;
        destArray.stackArray[0xf]._4_4_ = destArray.stackArray[0xf]._4_4_ + 1;
      }
      UVector::setSize(dest,destArray.stackArray[0xf]._4_4_,this->fStatus);
    }
  }
  MaybeStackArray<void_*,_16>::~MaybeStackArray((MaybeStackArray<void_*,_16> *)local_150);
  MaybeStackArray<void_*,_16>::~MaybeStackArray
            ((MaybeStackArray<void_*,_16> *)(sourceArray.stackArray + 0xf));
  return;
}

Assistant:

void RBBITableBuilder::setAdd(UVector *dest, UVector *source) {
    int32_t destOriginalSize = dest->size();
    int32_t sourceSize       = source->size();
    int32_t di           = 0;
    MaybeStackArray<void *, 16> destArray, sourceArray;  // Handle small cases without malloc
    void **destPtr, **sourcePtr;
    void **destLim, **sourceLim;

    if (destOriginalSize > destArray.getCapacity()) {
        if (destArray.resize(destOriginalSize) == NULL) {
            return;
        }
    }
    destPtr = destArray.getAlias();
    destLim = destPtr + destOriginalSize;  // destArray.getArrayLimit()?

    if (sourceSize > sourceArray.getCapacity()) {
        if (sourceArray.resize(sourceSize) == NULL) {
            return;
        }
    }
    sourcePtr = sourceArray.getAlias();
    sourceLim = sourcePtr + sourceSize;  // sourceArray.getArrayLimit()?

    // Avoid multiple "get element" calls by getting the contents into arrays
    (void) dest->toArray(destPtr);
    (void) source->toArray(sourcePtr);

    dest->setSize(sourceSize+destOriginalSize, *fStatus);

    while (sourcePtr < sourceLim && destPtr < destLim) {
        if (*destPtr == *sourcePtr) {
            dest->setElementAt(*sourcePtr++, di++);
            destPtr++;
        }
        // This check is required for machines with segmented memory, like i5/OS.
        // Direct pointer comparison is not recommended.
        else if (uprv_memcmp(destPtr, sourcePtr, sizeof(void *)) < 0) {
            dest->setElementAt(*destPtr++, di++);
        }
        else { /* *sourcePtr < *destPtr */
            dest->setElementAt(*sourcePtr++, di++);
        }
    }

    // At most one of these two cleanup loops will execute
    while (destPtr < destLim) {
        dest->setElementAt(*destPtr++, di++);
    }
    while (sourcePtr < sourceLim) {
        dest->setElementAt(*sourcePtr++, di++);
    }

    dest->setSize(di, *fStatus);
}